

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O1

int FindDiffPoint(FName *name1,char *str2)

{
  char cVar1;
  char cVar2;
  char *pcVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  
  pcVar3 = FName::NameData.NameArray[name1->Index].Text;
  lVar6 = 0;
  do {
    cVar1 = pcVar3[lVar6];
    iVar4 = tolower((int)cVar1);
    cVar2 = str2[lVar6];
    iVar5 = tolower((int)cVar2);
    lVar6 = lVar6 + 1;
    if ((cVar2 == '\0') || (cVar1 == '\0')) break;
  } while (iVar4 == iVar5);
  return (int)lVar6 + -1;
}

Assistant:

static int FindDiffPoint (FName name1, const char *str2)
{
	const char *str1 = name1.GetChars();
	int i;

	for (i = 0; tolower(str1[i]) == tolower(str2[i]); i++)
		if (str1[i] == 0 || str2[i] == 0)
			break;

	return i;
}